

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PickElement::forward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  uint uVar2;
  const_reference ppTVar3;
  ostream *poVar4;
  void *this_00;
  Scalar *pSVar5;
  size_type sVar6;
  Dim *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long in_RDI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x_1;
  uint b;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Index in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Tensor *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  Tensor *in_stack_ffffffffffffffb8;
  uint local_3c;
  
  if (*(long *)(in_RDI + 0x58) == 0) {
    if (*(long *)(in_RDI + 0x78) == 0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x615,
                    "virtual void cnn::PickElement::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78));
    uVar2 = Dim::batch_elems(in_RDX);
    if (sVar6 != uVar2) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x616,
                    "virtual void cnn::PickElement::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    for (local_3c = 0;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78))
        , local_3c < sVar6; local_3c = local_3c + 1) {
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
      Tensor::batch_matrix(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x78),
                 (ulong)local_3c);
      pSVar5 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
      *(Scalar *)(*(long *)(in_RDX[1].d + 1) + (ulong)local_3c * 4) = *pSVar5;
    }
  }
  else {
    uVar2 = **(uint **)(in_RDI + 0x58);
    ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,0);
    uVar1 = Dim::rows(&(*ppTVar3)->d);
    if (uVar1 <= uVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ")
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,**(uint **)(in_RDI + 0x58));
      poVar4 = std::operator<<(poVar4,"from a vector of length ");
      ppTVar3 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                          (in_RSI,0);
      uVar2 = Dim::rows(&(*ppTVar3)->d);
      this_00 = (void *)std::ostream::operator<<(poVar4,uVar2);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_ffffffffffffffa8);
    pSVar5 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)CONCAT44(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
    **(Scalar **)(in_RDX[1].d + 1) = *pSVar5;
  }
  return;
}

Assistant:

void PickElement::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << "from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    auto x = **xs[0];
    fx.v[0] = x(*pval);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    for(unsigned b = 0; b < pvals->size(); ++b) {
      auto x = xs[0]->batch_matrix(b);
      fx.v[b] = x((*pvals)[b]);
    }
  }
#endif
}